

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
spvtools::opt::anon_unknown_0::GetWordsFromNumericScalarOrVectorConstant
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          ConstantManager *const_mgr,Constant *c)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *this;
  reference ppCVar3;
  iterator __first;
  iterator __last;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_88;
  const_iterator local_80;
  undefined1 local_78 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> comp_in_words;
  Constant *comp;
  const_iterator __end5;
  const_iterator __begin5;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *__range5;
  VectorConstant *vec_constant;
  IntConstant *int_constant;
  FloatConstant *float_constant;
  Constant *c_local;
  ConstantManager *const_mgr_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *words;
  
  iVar2 = (*c->_vptr_Constant[0xf])();
  if ((FloatConstant *)CONCAT44(extraout_var,iVar2) == (FloatConstant *)0x0) {
    iVar2 = (*c->_vptr_Constant[0xe])();
    if ((IntConstant *)CONCAT44(extraout_var_00,iVar2) == (IntConstant *)0x0) {
      iVar2 = (*c->_vptr_Constant[0x13])();
      if ((long *)CONCAT44(extraout_var_01,iVar2) == (long *)0x0) {
        memset(__return_storage_ptr__,0,0x18);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
      }
      else {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
        this = (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0xc0))();
        __end5 = std::
                 vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                 ::begin(this);
        comp = (Constant *)
               std::
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               ::end(this);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                                           *)&comp), bVar1) {
          ppCVar3 = __gnu_cxx::
                    __normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                    ::operator*(&__end5);
          comp_in_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*ppCVar3;
          GetWordsFromNumericScalarOrVectorConstant
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,const_mgr,
                     (Constant *)
                     comp_in_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
          local_88._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 (__return_storage_ptr__);
          __gnu_cxx::
          __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          ::__normal_iterator<unsigned_int*>
                    ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      *)&local_80,&local_88);
          __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
          __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                     local_80,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               )__first._M_current,
                     (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )__last._M_current);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
          __gnu_cxx::
          __normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
          ::operator++(&__end5);
        }
      }
    }
    else {
      GetWordsFromScalarIntConstant
                (__return_storage_ptr__,(IntConstant *)CONCAT44(extraout_var_00,iVar2));
    }
  }
  else {
    GetWordsFromScalarFloatConstant
              (__return_storage_ptr__,(FloatConstant *)CONCAT44(extraout_var,iVar2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> GetWordsFromNumericScalarOrVectorConstant(
    analysis::ConstantManager* const_mgr, const analysis::Constant* c) {
  if (const auto* float_constant = c->AsFloatConstant()) {
    return GetWordsFromScalarFloatConstant(float_constant);
  } else if (const auto* int_constant = c->AsIntConstant()) {
    return GetWordsFromScalarIntConstant(int_constant);
  } else if (const auto* vec_constant = c->AsVectorConstant()) {
    std::vector<uint32_t> words;
    for (const auto* comp : vec_constant->GetComponents()) {
      auto comp_in_words =
          GetWordsFromNumericScalarOrVectorConstant(const_mgr, comp);
      words.insert(words.end(), comp_in_words.begin(), comp_in_words.end());
    }
    return words;
  }
  return {};
}